

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXTokenizer.cpp
# Opt level: O0

void Assimp::FBX::Tokenize(TokenList *output_tokens,char *input)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Token *pTVar4;
  bool local_111;
  char *local_c8;
  char *peek;
  TokenType type;
  Token *local_98;
  Token *local_90;
  Token *local_88 [3];
  allocator local_69;
  string local_68;
  char local_41;
  char *pcStack_40;
  char c;
  char *cur;
  char *token_end;
  char *token_begin;
  uint local_20;
  bool pending_data_token;
  bool in_double_quotes;
  uint uStack_1c;
  bool comment;
  uint column;
  uint line;
  char *input_local;
  TokenList *output_tokens_local;
  
  uStack_1c = 1;
  local_20 = 1;
  token_begin._7_1_ = 0;
  token_begin._6_1_ = 0;
  token_begin._5_1_ = 0;
  token_end = (char *)0x0;
  cur = (char *)0x0;
  pcStack_40 = input;
  _column = input;
  input_local = (char *)output_tokens;
  do {
    if (*pcStack_40 == '\0') {
      return;
    }
    local_41 = *pcStack_40;
    bVar2 = IsLineEnd<char>(local_41);
    if (bVar2) {
      token_begin._7_1_ = 0;
      local_20 = 0;
      uStack_1c = uStack_1c + 1;
    }
    if ((token_begin._7_1_ & 1) == 0) {
      if ((token_begin._6_1_ & 1) == 0) {
        if (local_41 == '\"') {
          if (token_end != (char *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_68,"unexpected double-quote",&local_69);
            anon_unknown_3::TokenizeError(&local_68,uStack_1c,local_20);
          }
          token_end = pcStack_40;
          token_begin._6_1_ = 1;
        }
        else if (local_41 == ',') {
          if ((token_begin._5_1_ & 1) != 0) {
            anon_unknown_3::ProcessDataToken
                      ((TokenList *)input_local,&token_end,&cur,uStack_1c,local_20,TokenType_DATA,
                       true);
          }
          pcVar1 = input_local;
          pTVar4 = (Token *)operator_new(0x28);
          Token::Token(pTVar4,pcStack_40,pcStack_40 + 1,TokenType_COMMA,uStack_1c,local_20);
          local_98 = pTVar4;
          std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
          push_back((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                     *)pcVar1,&local_98);
        }
        else if (local_41 == ':') {
          if ((token_begin._5_1_ & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&type,"unexpected colon",(allocator *)((long)&peek + 7));
            anon_unknown_3::TokenizeError((string *)&type,uStack_1c,local_20);
          }
          anon_unknown_3::ProcessDataToken
                    ((TokenList *)input_local,&token_end,&cur,uStack_1c,local_20,TokenType_KEY,true)
          ;
        }
        else if (local_41 == ';') {
          anon_unknown_3::ProcessDataToken
                    ((TokenList *)input_local,&token_end,&cur,uStack_1c,local_20,TokenType_DATA,
                     false);
          token_begin._7_1_ = 1;
        }
        else if (local_41 == '{') {
          anon_unknown_3::ProcessDataToken
                    ((TokenList *)input_local,&token_end,&cur,uStack_1c,local_20,TokenType_DATA,
                     false);
          pcVar1 = input_local;
          pTVar4 = (Token *)operator_new(0x28);
          Token::Token(pTVar4,pcStack_40,pcStack_40 + 1,TokenType_OPEN_BRACKET,uStack_1c,local_20);
          local_88[0] = pTVar4;
          std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
          push_back((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                     *)pcVar1,local_88);
        }
        else if (local_41 == '}') {
          anon_unknown_3::ProcessDataToken
                    ((TokenList *)input_local,&token_end,&cur,uStack_1c,local_20,TokenType_DATA,
                     false);
          pcVar1 = input_local;
          pTVar4 = (Token *)operator_new(0x28);
          Token::Token(pTVar4,pcStack_40,pcStack_40 + 1,TokenType_CLOSE_BRACKET,uStack_1c,local_20);
          local_90 = pTVar4;
          std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
          push_back((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                     *)pcVar1,&local_90);
        }
        else {
          bVar2 = IsSpaceOrNewLine<char>(local_41);
          if (bVar2) {
            if (token_end != (char *)0x0) {
              peek._0_4_ = TokenType_DATA;
              local_c8 = pcStack_40;
              while( true ) {
                local_111 = false;
                if (*local_c8 != '\0') {
                  local_111 = IsSpaceOrNewLine<char>(*local_c8);
                }
                if (local_111 == false) goto LAB_001cbe28;
                if (*local_c8 == ':') break;
                local_c8 = local_c8 + 1;
              }
              peek._0_4_ = TokenType_KEY;
              pcStack_40 = local_c8;
LAB_001cbe28:
              anon_unknown_3::ProcessDataToken
                        ((TokenList *)input_local,&token_end,&cur,uStack_1c,local_20,(TokenType)peek
                         ,false);
            }
            token_begin._5_1_ = 0;
          }
          else {
            cur = pcStack_40;
            if (token_end == (char *)0x0) {
              token_end = pcStack_40;
            }
            token_begin._5_1_ = 1;
          }
        }
      }
      else if (local_41 == '\"') {
        token_begin._6_1_ = 0;
        cur = pcStack_40;
        anon_unknown_3::ProcessDataToken
                  ((TokenList *)input_local,&token_end,&cur,uStack_1c,local_20,TokenType_DATA,false)
        ;
        token_begin._5_1_ = 0;
      }
    }
    iVar3 = 1;
    if (*pcStack_40 == '\t') {
      iVar3 = 4;
    }
    local_20 = iVar3 + local_20;
    pcStack_40 = pcStack_40 + 1;
  } while( true );
}

Assistant:

void Tokenize(TokenList& output_tokens, const char* input)
{
    ai_assert(input);

    // line and column numbers numbers are one-based
    unsigned int line = 1;
    unsigned int column = 1;

    bool comment = false;
    bool in_double_quotes = false;
    bool pending_data_token = false;

    const char* token_begin = NULL, *token_end = NULL;
    for (const char* cur = input;*cur;column += (*cur == '\t' ? ASSIMP_FBX_TAB_WIDTH : 1), ++cur) {
        const char c = *cur;

        if (IsLineEnd(c)) {
            comment = false;

            column = 0;
            ++line;
        }

        if(comment) {
            continue;
        }

        if(in_double_quotes) {
            if (c == '\"') {
                in_double_quotes = false;
                token_end = cur;

                ProcessDataToken(output_tokens,token_begin,token_end,line,column);
                pending_data_token = false;
            }
            continue;
        }

        switch(c)
        {
        case '\"':
            if (token_begin) {
                TokenizeError("unexpected double-quote", line, column);
            }
            token_begin = cur;
            in_double_quotes = true;
            continue;

        case ';':
            ProcessDataToken(output_tokens,token_begin,token_end,line,column);
            comment = true;
            continue;

        case '{':
            ProcessDataToken(output_tokens,token_begin,token_end, line, column);
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_OPEN_BRACKET,line,column));
            continue;

        case '}':
            ProcessDataToken(output_tokens,token_begin,token_end,line,column);
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_CLOSE_BRACKET,line,column));
            continue;

        case ',':
            if (pending_data_token) {
                ProcessDataToken(output_tokens,token_begin,token_end,line,column,TokenType_DATA,true);
            }
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_COMMA,line,column));
            continue;

        case ':':
            if (pending_data_token) {
                ProcessDataToken(output_tokens,token_begin,token_end,line,column,TokenType_KEY,true);
            }
            else {
                TokenizeError("unexpected colon", line, column);
            }
            continue;
        }

        if (IsSpaceOrNewLine(c)) {

            if (token_begin) {
                // peek ahead and check if the next token is a colon in which
                // case this counts as KEY token.
                TokenType type = TokenType_DATA;
                for (const char* peek = cur;  *peek && IsSpaceOrNewLine(*peek); ++peek) {
                    if (*peek == ':') {
                        type = TokenType_KEY;
                        cur = peek;
                        break;
                    }
                }

                ProcessDataToken(output_tokens,token_begin,token_end,line,column,type);
            }

            pending_data_token = false;
        }
        else {
            token_end = cur;
            if (!token_begin) {
                token_begin = cur;
            }

            pending_data_token = true;
        }
    }
}